

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O3

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_Pred4_Test::Body
          (iu_SyntaxTest_x_iutest_x_Pred4_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator<char> local_1f9;
  AssertionResult iutest_ar;
  int in_stack_fffffffffffffe30;
  int iVar2;
  undefined4 in_stack_fffffffffffffe34;
  int in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 uStack_1bc;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  undefined1 local_1a0 [392];
  
  iutest::AssertPred4Helper<bool(*)(int,int,int,int),int,int,int,int>
            ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest4,(char *)0x2ec401,
             (_func_bool_int_int_int_int *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),in_stack_fffffffffffffe38
             ,in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,in_stack_fffffffffffffe50);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iVar2 = 1;
    iutest::detail::iuStreamMessage::operator<<
              ((iuStreamMessage *)local_1a0,(int *)&stack0xfffffffffffffe30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffe30,iutest_ar.m_message._M_dataplus._M_p,&local_1f9);
    iutest::AssertionHelper::OnFixed
              ((AssertionHelper *)&stack0xfffffffffffffe30,(Fixed *)local_1a0,false);
    if ((undefined1 *)CONCAT44(in_stack_fffffffffffffe34,iVar2) != &stack0xfffffffffffffe40) {
      operator_delete((undefined1 *)CONCAT44(in_stack_fffffffffffffe34,iVar2),
                      CONCAT44(uStack_1bc,in_stack_fffffffffffffe40) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p == &iutest_ar.m_message.field_2) {
      return;
    }
  }
  else {
    paVar1 = &iutest_ar.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::AssertPred4Helper<bool(*)(int,int,int,int),int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest4,(char *)0x2ec468,
               (_func_bool_int_int_int_int *)
               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe50);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      in_stack_fffffffffffffe30 = 1;
      iutest::detail::iuStreamMessage::operator<<
                ((iuStreamMessage *)local_1a0,(int *)&stack0xfffffffffffffe30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffe30,iutest_ar.m_message._M_dataplus._M_p,&local_1f9)
      ;
      in_stack_fffffffffffffe50 = 0x33adb0;
      iutest::AssertionHelper::OnFixed
                ((AssertionHelper *)&stack0xfffffffffffffe30,(Fixed *)local_1a0,false);
      if ((undefined1 *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30) !=
          &stack0xfffffffffffffe40) {
        operator_delete((undefined1 *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                        CONCAT44(uStack_1bc,in_stack_fffffffffffffe40) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::AssertPred4Helper<bool(*)(int,int,int,int),int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest4,(char *)0x2ec573,
               (_func_bool_int_int_int_int *)
               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe50);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      in_stack_fffffffffffffe30 = 1;
      iutest::detail::iuStreamMessage::operator<<
                ((iuStreamMessage *)local_1a0,(int *)&stack0xfffffffffffffe30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffe30,iutest_ar.m_message._M_dataplus._M_p,&local_1f9)
      ;
      in_stack_fffffffffffffe50 = 0x33adb0;
      iutest::AssertionHelper::OnFixed
                ((AssertionHelper *)&stack0xfffffffffffffe30,(Fixed *)local_1a0,false);
      if ((undefined1 *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30) !=
          &stack0xfffffffffffffe40) {
        operator_delete((undefined1 *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                        CONCAT44(uStack_1bc,in_stack_fffffffffffffe40) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::AssertPred4Helper<bool(*)(int,int,int,int),int,int,int,int>
              ((char *)0x2,(char *)0x1,(char *)0x0,(char *)PredTest4,(char *)0x2ec67e,
               (_func_bool_int_int_int_int *)
               CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe38,in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,
               in_stack_fffffffffffffe50);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a0,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a0);
      iVar2 = 1;
      iutest::detail::iuStreamMessage::operator<<
                ((iuStreamMessage *)local_1a0,(int *)&stack0xfffffffffffffe30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffe30,iutest_ar.m_message._M_dataplus._M_p,&local_1f9)
      ;
      iutest::AssertionHelper::OnFixed
                ((AssertionHelper *)&stack0xfffffffffffffe30,(Fixed *)local_1a0,false);
      if ((undefined1 *)CONCAT44(in_stack_fffffffffffffe34,iVar2) != &stack0xfffffffffffffe40) {
        operator_delete((undefined1 *)CONCAT44(in_stack_fffffffffffffe34,iVar2),
                        CONCAT44(uStack_1bc,in_stack_fffffffffffffe40) + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
      std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                  iutest_ar.m_message.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

IUTEST(SyntaxTest, Pred4)
{
    if( int x=1 )
        IUTEST_ASSERT_PRED4(PredTest4, 0, x, 2, 3) << x;
    if( int x=1 )
        IUTEST_EXPECT_PRED4(PredTest4, 0, x, 2, 3) << x;
    if( int x=1 )
        IUTEST_INFORM_PRED4(PredTest4, 0, x, 2, 3) << x;
    if( int x=1 )
        IUTEST_ASSUME_PRED4(PredTest4, 0, x, 2, 3) << x;
}